

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

JavascriptArray * __thiscall Js::RecyclableArrayWalker::GetArrayObject(RecyclableArrayWalker *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptArray *local_20;
  RecyclableArrayWalker *this_local;
  
  bVar2 = Js::JavascriptArray::IsNonES5Array((this->super_RecyclableObjectWalker).instance);
  if (!bVar2) {
    bVar2 = VarIs<Js::ES5Array>((this->super_RecyclableObjectWalker).instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xbae,
                                  "(Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance))"
                                  ,
                                  "Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  bVar2 = VarIs<Js::ES5Array>((this->super_RecyclableObjectWalker).instance);
  if (bVar2) {
    local_20 = (JavascriptArray *)
               VarTo<Js::RecyclableObject>((this->super_RecyclableObjectWalker).instance);
  }
  else {
    local_20 = VarTo<Js::JavascriptArray>((this->super_RecyclableObjectWalker).instance);
  }
  return local_20;
}

Assistant:

Js::JavascriptArray* RecyclableArrayWalker::GetArrayObject()
    {
        Assert(Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance));
        return  Js::VarIs<Js::ES5Array>(instance) ?
                    static_cast<Js::JavascriptArray *>(VarTo<RecyclableObject>(instance)) :
                    Js::VarTo<Js::JavascriptArray>(instance);
    }